

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O0

bool mpt::add_items(metatype *to,node *head,relation *relation,logger *out)

{
  ulong uVar1;
  type_t tVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  collection *c;
  object *this;
  undefined4 extraout_var;
  char *pcVar6;
  undefined4 extraout_var_00;
  undefined8 uVar7;
  convertable *pcVar8;
  undefined4 extraout_var_01;
  object *poVar9;
  undefined1 local_238 [8];
  relation rel;
  group *ig;
  object *curr;
  string local_200 [32];
  uint local_1e0;
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  identifier id;
  string local_1a0 [32];
  object *local_180;
  object *src;
  object *obj_1;
  string local_168 [32];
  relation local_148;
  convertable *local_128;
  convertable *curr_1;
  char *pcStack_118;
  int ilen;
  char *ident;
  string local_108 [32];
  relation local_e8;
  allocator local_c1;
  string local_c0 [32];
  int local_a0;
  undefined4 uStack_9c;
  size_t len;
  char *pos;
  char *start;
  value val;
  char *name;
  reference<mpt::metatype> local_60;
  reference<mpt::metatype> m;
  metatype *from;
  object *obj;
  group *grp;
  char cStack_38;
  char _func [15];
  logger *out_local;
  relation *relation_local;
  node *head_local;
  metatype *to_local;
  
  grp._1_1_ = 'm';
  grp._2_1_ = 'p';
  grp._3_1_ = 't';
  grp._4_1_ = ':';
  grp._5_1_ = ':';
  grp._6_1_ = 'a';
  grp._7_1_ = 'd';
  cStack_38 = 'd';
  builtin_strncpy(_func,"_items",7);
  _func._7_8_ = out;
  c = &convertable::operator_cast_to_group_(&to->super_convertable)->super_collection;
  this = convertable::operator_cast_to_object_(&to->super_convertable);
  relation_local = (relation *)head;
  if ((c == (collection *)0x0) && (this == (object *)0x0)) {
    to_local._7_1_ = 1;
  }
  else {
    for (; relation_local != (relation *)0x0;
        relation_local = (relation *)relation_local[1]._vptr_relation) {
      m._ref = (metatype *)relation_local->_vptr_relation;
      if (((c != (collection *)0x0) && (m._ref != (metatype *)0x0)) &&
         (iVar5 = (*((m._ref)->super_convertable)._vptr_convertable[2])(),
         CONCAT44(extraout_var,iVar5) != 0)) {
        reference<mpt::metatype>::reference(&local_60,(metatype *)0x0);
        reference<mpt::metatype>::set_instance(&local_60,m._ref);
        iVar5 = (*c->_vptr_collection[2])(c,relation_local + 5,m._ref);
        if (iVar5 < 0) {
          reference<mpt::metatype>::detach(&local_60);
        }
        else if (_func._7_8_ != 0) {
          logger::message((logger *)_func._7_8_,(char *)((long)&grp + 1),4,"%s %p: %s","group",c,
                          "failed to add object");
        }
        reference<mpt::metatype>::~reference(&local_60);
        goto LAB_001430b7;
      }
      val._type = mpt_node_ident(relation_local);
      if (val._type == 0) {
        if (_func._7_8_ != 0) {
          logger::message((logger *)_func._7_8_,(char *)((long)&grp + 1),3,"%s %p: %s","node",
                          relation_local,"bad element name");
        }
        to_local._7_1_ = 0;
        goto LAB_001430da;
      }
      if (this == (object *)0x0) {
LAB_001424e6:
        if (c != (collection *)0x0) {
          len = val._type;
          pos = (char *)val._type;
          val._type = mpt_convert_key(&len,0,&local_a0);
          if ((((char *)val._type == (char *)0x0) || ((char *)val._type != pos)) ||
             (*(char *)val._type == '\0')) {
            if (_func._7_8_ != 0) {
              logger::message((logger *)_func._7_8_,(char *)((long)&grp + 1),4,"%s: %s",
                              "bad element name",pos);
            }
          }
          else {
            iVar5 = (*c->_vptr_collection[3])(c,val._type,local_a0);
            uVar3 = _func._7_8_;
            tVar2 = val._type;
            m._ref = (metatype *)CONCAT44(extraout_var_00,iVar5);
            if (m._ref == (metatype *)0x0) {
              if (_func._7_8_ != 0) {
                uVar1 = CONCAT44(uStack_9c,local_a0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_c0,(char *)tVar2,uVar1,&local_c1);
                uVar7 = std::__cxx11::string::c_str();
                logger::message((logger *)uVar3,(char *)((long)&grp + 1),4,"%s: %s",
                                "invalid item type",uVar7);
                std::__cxx11::string::~string(local_c0);
                std::allocator<char>::~allocator((allocator<char> *)&local_c1);
              }
            }
            else {
              val._type = mpt_convert_key(&len,":",&local_a0);
              if ((val._type == 0) || (CONCAT44(uStack_9c,local_a0) == 0)) {
                if (_func._7_8_ != 0) {
                  logger::message((logger *)_func._7_8_,(char *)((long)&grp + 1),4,"%s",
                                  "empty item name");
                }
                (*((m._ref)->super_convertable)._vptr_convertable[1])();
              }
              else {
                collection::relation::relation(&local_e8,c,(relation *)0x0,'.');
                iVar5 = convertable::type(&(m._ref)->super_convertable);
                pcVar8 = collection::relation::find
                                   (&local_e8,(long)iVar5,(char *)val._type,local_a0);
                collection::relation::~relation(&local_e8);
                uVar3 = _func._7_8_;
                tVar2 = val._type;
                if (pcVar8 == (convertable *)0x0) {
                  pcStack_118 = (char *)val._type;
                  curr_1._4_4_ = local_a0;
                  while (val._type = mpt_convert_key(&len,0,&local_a0), val._type != 0) {
                    if (relation == (relation *)0x0) {
                      collection::relation::relation(&local_148,c,(relation *)0x0,'.');
                      iVar5 = convertable::type(&(m._ref)->super_convertable);
                      local_128 = collection::relation::find
                                            (&local_148,(long)iVar5,(char *)val._type,local_a0);
                      collection::relation::~relation(&local_148);
                    }
                    else {
                      iVar5 = convertable::type(&(m._ref)->super_convertable);
                      iVar5 = (**relation->_vptr_relation)(relation,(long)iVar5,val._type,local_a0);
                      local_128 = (convertable *)CONCAT44(extraout_var_01,iVar5);
                    }
                    uVar3 = _func._7_8_;
                    if (local_128 == (convertable *)0x0) {
                      if (_func._7_8_ != 0) {
                        pcVar6 = identifier::name((identifier *)(relation_local + 5));
                        tVar2 = val._type;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  (local_168,(char *)tVar2,CONCAT44(uStack_9c,local_a0),
                                   (allocator *)((long)&obj_1 + 7));
                        uVar7 = std::__cxx11::string::c_str();
                        logger::message((logger *)uVar3,(char *)((long)&grp + 1),3,"%s: \'%s\': %s",
                                        "unable to get parent",pcVar6,uVar7);
                        std::__cxx11::string::~string(local_168);
                        std::allocator<char>::~allocator((allocator<char> *)((long)&obj_1 + 7));
                      }
                      (*((m._ref)->super_convertable)._vptr_convertable[1])();
                      to_local._7_1_ = 0;
                      goto LAB_001430da;
                    }
                    local_180 = convertable::operator_cast_to_object_(local_128);
                    if ((local_180 == (object *)0x0) ||
                       (src = convertable::operator_cast_to_object_(&(m._ref)->super_convertable),
                       src == (object *)0x0)) {
                      (*((m._ref)->super_convertable)._vptr_convertable[1])();
                      uVar3 = _func._7_8_;
                      if (_func._7_8_ != 0) {
                        pcVar6 = identifier::name((identifier *)(relation_local + 5));
                        tVar2 = val._type;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  (local_1a0,(char *)tVar2,CONCAT44(uStack_9c,local_a0),
                                   (allocator *)((long)&id._base + 7));
                        uVar7 = std::__cxx11::string::c_str();
                        logger::message((logger *)uVar3,(char *)((long)&grp + 1),3,"%s: \'%s\': %s",
                                        "unable to get inheritance",pcVar6,uVar7);
                        std::__cxx11::string::~string(local_1a0);
                        std::allocator<char>::~allocator((allocator<char> *)((long)&id._base + 7));
                      }
                      to_local._7_1_ = 0;
                      goto LAB_001430da;
                    }
                    object::set(src,local_180,(logger *)_func._7_8_);
                  }
                  identifier::identifier((identifier *)local_1b8,0x10);
                  bVar4 = identifier::set_name((identifier *)local_1b8,pcStack_118,curr_1._4_4_);
                  uVar3 = _func._7_8_;
                  pcVar6 = pcStack_118;
                  if (bVar4) {
                    iVar5 = (*c->_vptr_collection[2])(c,local_1b8,m._ref);
                    if (iVar5 < 0) {
                      (*((m._ref)->super_convertable)._vptr_convertable[1])();
                      uVar3 = _func._7_8_;
                      pcVar6 = pcStack_118;
                      if (_func._7_8_ != 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  (local_200,pcVar6,(long)curr_1._4_4_,
                                   (allocator *)((long)&curr + 7));
                        uVar7 = std::__cxx11::string::c_str();
                        logger::message((logger *)uVar3,(char *)((long)&grp + 1),3,"%s: %s",
                                        "unable add item",uVar7);
                        std::__cxx11::string::~string(local_200);
                        std::allocator<char>::~allocator((allocator<char> *)((long)&curr + 7));
                      }
                      local_1e0 = 4;
                    }
                    else if (relation_local[4]._vptr_relation == (_func_int **)0x0) {
                      local_1e0 = 4;
                    }
                    else {
                      poVar9 = convertable::operator_cast_to_object_(&(m._ref)->super_convertable);
                      if ((poVar9 == (object *)0x0) && (_func._7_8_ != 0)) {
                        logger::message((logger *)_func._7_8_,(char *)((long)&grp + 1),4,
                                        "%s (%p): %s",val._type,m._ref,"element not an object");
                      }
                      if ((relation == (relation *)0x0) ||
                         (rel._24_8_ = convertable::operator_cast_to_group_
                                                 (&(m._ref)->super_convertable),
                         (collection *)rel._24_8_ == (collection *)0x0)) {
                        bVar4 = add_items(m._ref,(node *)relation_local[4]._vptr_relation,
                                          (relation *)0x0,(logger *)_func._7_8_);
                        if (bVar4) {
                          local_1e0 = 4;
                        }
                        else {
                          to_local._7_1_ = 0;
                          local_1e0 = 1;
                        }
                      }
                      else {
                        collection::relation::relation
                                  ((relation *)local_238,(collection *)rel._24_8_,relation,'.');
                        bVar4 = add_items(m._ref,(node *)relation_local[4]._vptr_relation,
                                          (relation *)local_238,(logger *)_func._7_8_);
                        if (!bVar4) {
                          to_local._7_1_ = 0;
                        }
                        local_1e0 = (uint)!bVar4;
                        collection::relation::~relation((relation *)local_238);
                      }
                    }
                  }
                  else {
                    if (_func._7_8_ != 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_1d8,pcVar6,(long)curr_1._4_4_,&local_1d9);
                      uVar7 = std::__cxx11::string::c_str();
                      logger::message((logger *)uVar3,(char *)((long)&grp + 1),3,"%s: %s",
                                      "unable add item",uVar7);
                      std::__cxx11::string::~string(local_1d8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
                    }
                    local_1e0 = 4;
                  }
                  identifier::~identifier((identifier *)local_1b8);
                  if ((local_1e0 != 0) && (local_1e0 == 1)) goto LAB_001430da;
                }
                else {
                  if (_func._7_8_ != 0) {
                    uVar1 = CONCAT44(uStack_9c,local_a0);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_108,(char *)tVar2,uVar1,(allocator *)((long)&ident + 7));
                    uVar7 = std::__cxx11::string::c_str();
                    logger::message((logger *)uVar3,(char *)((long)&grp + 1),4,"%s: %s",
                                    "conflicting item name",uVar7);
                    std::__cxx11::string::~string(local_108);
                    std::allocator<char>::~allocator((allocator<char> *)((long)&ident + 7));
                  }
                  (*((m._ref)->super_convertable)._vptr_convertable[1])();
                }
              }
            }
          }
        }
      }
      else if ((c != (collection *)0x0) ||
              (iVar5 = (*this->_vptr_object[1])(this,val._type,m._ref), iVar5 < 0)) {
        if (m._ref == (metatype *)0x0) goto LAB_001424e6;
        value::value((value *)&start);
        bVar4 = convertable::get<mpt::value>(&(m._ref)->super_convertable,(value *)&start);
        if ((!bVar4) ||
           (bVar4 = object::set(this,(char *)val._type,(value *)&start,(logger *)_func._7_8_),
           !bVar4)) {
          tVar2 = val._type;
          pcVar6 = convertable::string(&(m._ref)->super_convertable);
          object::set(this,(char *)tVar2,pcVar6,(logger *)_func._7_8_);
        }
      }
LAB_001430b7:
    }
    to_local._7_1_ = 1;
  }
LAB_001430da:
  return (bool)(to_local._7_1_ & 1);
}

Assistant:

bool add_items(metatype &to, const node *head, const relation *relation, logger *out)
{
	const char _func[] = "mpt::add_items";
	group *grp = to;
	object *obj = to;
	
	// no assignable target
	if (!grp && !obj) {
		return true;
	}
	
	for (; head; head = head->next) {
		metatype *from = head->_meta;
		
		if (grp && from && from->addref()) {
			reference<metatype> m;
			m.set_instance(from);
			if (grp->append(&head->ident, from) < 0) {
				m.detach();
			}
			else if (out) {
				out->message(_func, out->Warning, "%s %p: %s",
				             MPT_tr("group"), grp, MPT_tr("failed to add object"));
			}
			continue;
		}
		// name is property
		const char *name;
		
		if (!(name = mpt_node_ident(head))) {
			if (out) {
				out->message(_func, out->Error, "%s %p: %s",
				             MPT_tr("node"), head, MPT_tr("bad element name"));
			}
			return false;
		}
		// set property
		if (obj) {
			if (!grp) {
				if (obj->set_property(name, from) >= 0) {
					continue;
				}
			}
			if (from) {
				value val;
				
				if (from->get(val)) {
					if (obj->set(name, val, out)) {
						continue;
					}
				}
				obj->set(name, from->string(), out);
				continue;
			}
		}
		if (!grp) {
			continue;
		}
		// get item type
		const char *start, *pos;
		size_t len;
		start = pos = name;
		name = mpt_convert_key(&pos, 0, &len);
		if (!name || name != start || !*name) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("bad element name"), start);
			}
			continue;
		}
		// create item
		if (!(from = grp->create(name, len))) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("invalid item type"), std::string(name, len).c_str());
			}
			continue;
		}
		// get item name
		name = mpt_convert_key(&pos, ":", &len);
		
		if (!name || !len) {
			if (out) {
				out->message(_func, out->Warning, "%s",
				             MPT_tr("empty item name"));
			}
			from->unref();
			continue;
		}
		// name conflict on same level
		if (collection::relation(*grp).find(from->type(), name, len)) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("conflicting item name"), std::string(name, len).c_str());
			}
			from->unref();
			continue;
		}
		const char *ident = name;
		int ilen = len;
		
		// find dependant items
		while ((name = mpt_convert_key(&pos, 0, &len))) {
			convertable *curr;
			if (relation) {
				curr = relation->find(from->type(), name, len);
			} else {
				curr = collection::relation(*grp).find(from->type(), name, len);
			}
			if (!curr) {
				if (out) {
					out->message(_func, out->Error, "%s: '%s': %s",
					             MPT_tr("unable to get parent"), head->ident.name(), std::string(name, len).c_str());
				}
				from->unref();
				return false;
			}
			object *obj, *src;
			if ((src = *curr) && (obj = *from)) {
				obj->set(*src, out);
				continue;
			}
			from->unref();
			if (out) {
				out->message(_func, out->Error, "%s: '%s': %s",
				             MPT_tr("unable to get inheritance"), head->ident.name(), std::string(name, len).c_str());
			}
			return false;
		}
		// add item to group
		identifier id;
		if (!id.set_name(ident, ilen)) {
			if (out) {
				out->message(_func, out->Error, "%s: %s",
				             MPT_tr("unable add item"), std::string(ident, ilen).c_str());
			}
			continue;
		}
		if (grp->append(&id, from) < 0) {
			from->unref();
			if (out) {
				out->message(_func, out->Error, "%s: %s",
				             MPT_tr("unable add item"), std::string(ident, ilen).c_str());
			}
			continue;
		}
		// set properties and subitems
		if (!head->children) {
			continue;
		}
		// process child items
		object *curr;
		if (!(curr = *from)) {
			if (out) {
				out->message(_func, out->Warning, "%s (%p): %s",
				             name, from, MPT_tr("element not an object"));
			}
		}
		group *ig;
		if (!relation || !(ig = *from)) {
			if (!(add_items(*from, head->children, 0, out))) {
				return false;
			}
			continue;
		}
		collection::relation rel(*ig, relation);
		if (!(add_items(*from, head->children, &rel, out))) {
			return false;
		}
	}
	return true;
}